

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_SetPipeShared(cmsysProcess *cp,int prPipe,int shared)

{
  if (cp != (cmsysProcess *)0x0) {
    if (prPipe == 3) {
      cp->PipeSharedSTDERR = (uint)(shared != 0);
    }
    else if (prPipe == 2) {
      cp->PipeSharedSTDOUT = (uint)(shared != 0);
    }
    else {
      if (prPipe != 1) {
        return;
      }
      cp->PipeSharedSTDIN = (uint)(shared != 0);
    }
    if (shared != 0) {
      cmsysProcess_SetPipeFile(cp,prPipe,(char *)0x0);
      (cp->PipeNativeSTDIN + (ulong)(prPipe - 1) * 2)[0] = -1;
      (cp->PipeNativeSTDIN + (ulong)(prPipe - 1) * 2)[1] = -1;
    }
  }
  return;
}

Assistant:

void kwsysProcess_SetPipeShared(kwsysProcess* cp, int prPipe, int shared)
{
  if (!cp) {
    return;
  }

  switch (prPipe) {
    case kwsysProcess_Pipe_STDIN:
      cp->PipeSharedSTDIN = shared ? 1 : 0;
      break;
    case kwsysProcess_Pipe_STDOUT:
      cp->PipeSharedSTDOUT = shared ? 1 : 0;
      break;
    case kwsysProcess_Pipe_STDERR:
      cp->PipeSharedSTDERR = shared ? 1 : 0;
      break;
    default:
      return;
  }

  /* If we are sharing the pipe, do not redirect it to a file or use a
     native pipe.  */
  if (shared) {
    kwsysProcess_SetPipeFile(cp, prPipe, 0);
    kwsysProcess_SetPipeNative(cp, prPipe, 0);
  }
}